

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csvparams_tests.cpp
# Opt level: O1

void __thiscall
iu_CsvParamsFloatTest_x_iutest_x_Param_Test::Body(iu_CsvParamsFloatTest_x_iutest_x_Param_Test *this)

{
  float fVar1;
  ParamType_conflict *pPVar2;
  AssertionResult *in_R8;
  long lVar3;
  AssertionResult iutest_ar;
  AssertionResult iutest_ar_1;
  float *in_stack_fffffffffffffc28;
  undefined1 local_3c8 [32];
  char *local_3a8;
  undefined8 local_3a0;
  AssertionResult local_398;
  detail *local_370;
  long local_360 [2];
  string local_350;
  undefined1 local_330 [16];
  undefined1 local_320 [376];
  undefined1 local_1a8 [32];
  char *local_188;
  undefined8 local_180;
  ios_base local_128 [264];
  
  local_330._0_8_ = local_330._0_8_ & 0xffffffff00000000;
  pPVar2 = iutest::WithParamInterface<float>::GetParam();
  if (((float)local_330._0_4_ != *pPVar2) || (NAN((float)local_330._0_4_) || NAN(*pPVar2))) {
    local_3c8._0_8_ = local_3c8 + 0x10;
    local_3c8._8_8_ = 0;
    local_3c8[0x10] = '\0';
    local_3a8 = (char *)CONCAT71(local_3a8._1_7_,1);
  }
  else {
    in_R8 = (AssertionResult *)local_330;
    iutest::internal::CmpHelperOpFailure<float,float>
              ((AssertionResult *)local_3c8,(internal *)"0.0f","GetParam()","!=",(char *)in_R8,
               pPVar2,in_stack_fffffffffffffc28);
  }
  if (local_3a8._0_1_ == false) {
    memset((iu_global_format_stringstream *)local_330,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_330);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,(char *)local_3c8._0_8_,(allocator<char> *)&local_398);
    local_188 = 
    "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/csvparams_tests.cpp";
    local_180 = 0x100000072;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)local_1a8,(Fixed *)local_330,false);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_330);
    std::ios_base::~ios_base((ios_base *)(local_320 + 0x70));
  }
  if ((undefined1 *)local_3c8._0_8_ != local_3c8 + 0x10) {
    operator_delete((void *)local_3c8._0_8_,CONCAT71(local_3c8._17_7_,local_3c8[0x10]) + 1);
  }
  pPVar2 = iutest::WithParamInterface<float>::GetParam();
  local_330._0_8_ = &PTR__IMatcher_00141d30;
  local_330._8_4_ = *pPVar2;
  iutest::detail::ContainsMatcher<float>::operator()
            (&local_398,(ContainsMatcher<float> *)local_330,&CsvParamsFloatTest::check_params);
  if (local_398.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_330);
    iutest::detail::iuUniversalPrinter<float[5]>::Print
              (&CsvParamsFloatTest::check_params,(iu_ostream *)local_320);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_330);
    std::ios_base::~ios_base((ios_base *)(local_320 + 0x70));
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_350,local_370,"Contains( GetParam() )",(char *)&local_398,in_R8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_3c8,local_350._M_dataplus._M_p,(allocator<char> *)local_330);
    local_3a8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/csvparams_tests.cpp";
    local_3a0._0_4_ = 0x74;
    local_3a0._4_4_ = 2;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)local_3c8,(Fixed *)local_1a8,false);
    if ((undefined1 *)local_3c8._0_8_ != local_3c8 + 0x10) {
      operator_delete((void *)local_3c8._0_8_,CONCAT71(local_3c8._17_7_,local_3c8[0x10]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
    }
    if (local_370 != (detail *)local_360) {
      operator_delete(local_370,local_360[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
    std::ios_base::~ios_base(local_128);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398.m_message._M_dataplus._M_p != &local_398.m_message.field_2) {
    operator_delete(local_398.m_message._M_dataplus._M_p,
                    local_398.m_message.field_2._M_allocated_capacity + 1);
  }
  if (local_398.m_result != false) {
    lVar3 = 0;
    do {
      fVar1 = *(float *)((long)CsvParamsFloatTest::check_params + lVar3);
      pPVar2 = iutest::WithParamInterface<float>::GetParam();
      if ((fVar1 == *pPVar2) && (!NAN(fVar1) && !NAN(*pPVar2))) {
        *(undefined4 *)((long)CsvParamsFloatTest::check_params + lVar3) = 0;
        return;
      }
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0x14);
  }
  return;
}

Assistant:

IUTEST_P(CsvParamsFloatTest, Param)
{
    IUTEST_EXPECT_NE( 0.0f, GetParam() );
#if IUTEST_HAS_MATCHERS
    IUTEST_ASSERT_THAT( check_params, Contains( GetParam() ) );
#endif
    for( size_t i=0; i < IUTEST_PP_COUNTOF(check_params); ++i )
    {
        if( check_params[i] == GetParam() )
        {
            check_params[i] = 0.0f;
            break;
        }
    }
}